

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

bool Data649::saveArchive(char *fname,Issues *issues)

{
  int iVar1;
  pointer pIVar2;
  pointer pDVar3;
  char cVar4;
  ostream *this;
  long lVar5;
  Draw *draw;
  pointer pDVar6;
  Issue *issue;
  pointer pIVar7;
  ofstream fout;
  long local_230;
  filebuf local_228 [8];
  undefined8 auStack_220 [29];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ofstream *)&local_230,fname,_S_out);
  pIVar2 = (issues->super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pIVar7 = (issues->super__Vector_base<Data649::Issue,_std::allocator<Data649::Issue>_>).
                _M_impl.super__Vector_impl_data._M_start; pIVar7 != pIVar2; pIVar7 = pIVar7 + 1) {
    *(undefined8 *)((long)auStack_220 + *(long *)(local_230 + -0x18)) = 6;
    this = (ostream *)std::ostream::operator<<((ostream *)&local_230,pIVar7->year);
    *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = 4;
    std::ostream::operator<<(this,pIVar7->idYear);
    pDVar3 = (pIVar7->draws).super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pDVar6 = (pIVar7->draws).super__Vector_base<Data649::Draw,_std::allocator<Data649::Draw>_>.
                  _M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar3; pDVar6 = pDVar6 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
      for (lVar5 = 4; lVar5 != 0x1c; lVar5 = lVar5 + 4) {
        iVar1 = *(int *)((long)(pDVar6->nums)._M_elems + lVar5 + -4);
        *(undefined8 *)((long)auStack_220 + *(long *)(local_230 + -0x18)) = 3;
        std::ostream::operator<<((ostream *)&local_230,iVar1);
      }
    }
    cVar4 = (char)(ofstream *)&local_230;
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return true;
}

Assistant:

bool saveArchive(const char * fname, const Issues & issues) {
    std::ofstream fout(fname);

    for (auto & issue : issues) {
        fout << std::setw(6) << issue.year << std::setw(4) << issue.idYear;
        for (auto & draw : issue.draws) {
            fout << " ";
            for (auto num : draw.nums) {
                fout << std::setw(3) << num;
            }
        }
        fout << std::endl;
    }

    fout.close();

    return true;
}